

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::import_<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  __index_type *p_Var1;
  long *plVar2;
  undefined8 *puVar3;
  _Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *this_00;
  size_t sVar4;
  undefined8 uVar5;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var6;
  bool bVar7;
  _Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *p_Var8;
  char *pcVar9;
  Result<wasm::WATParser::TypeUse> *pRVar10;
  _Alloc_hider _Var11;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  Name name_00;
  Name NVar12;
  Name NVar13;
  Index pos;
  undefined1 auStack_238 [8];
  optional<wasm::Name> mod;
  optional<wasm::Name> nm;
  ImportNames names;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_1e0;
  TypeUse local_1c8;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  _Storage<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false> local_e8;
  char local_d0;
  char *local_c8;
  undefined1 local_c0 [8];
  optional<wasm::Name> name;
  Result<wasm::WATParser::TypeUse> _val;
  Result<wasm::WATParser::TypeUse> type;
  undefined8 uStack_50;
  long local_48;
  undefined8 uStack_40;
  char local_31;
  
  this = &ctx->in;
  sVar4 = (ctx->in).pos;
  expected._M_str = "import";
  expected._M_len = 6;
  bVar7 = Lexer::takeSExprStart(this,expected);
  if (!bVar7) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeName((optional<wasm::Name> *)auStack_238,this);
  if (mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"expected import module name","");
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               this,&local_188);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
        (undefined1 *)
        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8U)) {
      *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _9_7_,type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               _M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    _Var11._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00bc678a;
  }
  Lexer::takeName((optional<wasm::Name> *)
                  &mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_engaged,this);
  if (nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"expected import name","");
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               this,&local_168);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
        (undefined1 *)
        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8U)) {
      *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _9_7_,type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               _M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_188.field_2._M_allocated_capacity = local_168.field_2._M_allocated_capacity;
    _Var11._M_p = local_168._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00bc678a;
  }
  nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._16_8_ = auStack_238;
  names.mod.super_IString.str._M_len =
       mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  names.mod.super_IString.str._M_str =
       (char *)mod.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
  names.nm.super_IString.str._M_len =
       nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
  expected_00._M_str = "func";
  expected_00._M_len = 4;
  bVar7 = Lexer::takeSExprStart(this,expected_00);
  pos = (Index)sVar4;
  if (bVar7) {
    Lexer::takeID((optional<wasm::Name> *)local_c0,this);
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
    typeuse<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::TypeUse> *)p_Var1,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                    &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_engaged,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)p_Var1);
    if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\x01') {
      type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_,
                 _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                 name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_);
LAB_00bc6598:
      plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
      ;
      *(long **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
      if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
          &local_48) {
        *plVar2 = local_48;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_40;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
        *(long *)((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             local_48;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = uStack_50;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged);
LAB_00bc6c49:
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                        ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20))
      ;
      return __return_storage_ptr__;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                      &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged);
    local_31 = name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
    local_c8 = (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                       str._M_len;
    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
    local_48 = 0;
    names.nm.super_IString.str._M_str =
         (char *)_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
    pRVar10 = (Result<wasm::WATParser::TypeUse> *)&DAT_00000008;
    if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\0') {
      pRVar10 = &type;
    }
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_1e0,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)pRVar10);
    pcVar9 = local_c8;
    if (local_31 == '\0') {
      pcVar9 = (char *)0x0;
      local_c0 = (undefined1  [8])(char *)0x0;
    }
    local_d0 = '\0';
    local_1a8.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name_00.super_IString.str._M_str = pcVar9;
    name_00.super_IString.str._M_len = (size_t)local_c0;
    ParseModuleTypesCtx::addFunc
              ((Result<wasm::Ok> *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,ctx,name_00,
               (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               (ImportNames *)
               &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged,
               (TypeUse *)&names.nm.super_IString.str._M_str,
               (optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               &local_e8._M_value,&local_1a8,pos);
    if (local_1a8.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((local_d0 == '\x01') &&
       (local_d0 = '\0',
       local_e8._M_value.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
       .super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_e8._M_value.
                      super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8._M_value.
                            super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage - local_e8._0_8_);
    }
    if (local_1e0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ != 0) {
      operator_delete((void *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              _32_8_,
                      local_48 -
                      type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_);
    }
    if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] == '\x01') {
      type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_,
                 _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                 name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_);
LAB_00bc69a5:
      plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
      ;
      *(long **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
      if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
          &local_48) {
        *plVar2 = local_48;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_40;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
        *(long *)((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             local_48;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      goto LAB_00bc6c49;
    }
LAB_00bc6a8e:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
               &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
  }
  else {
    expected_01._M_str = "table";
    expected_01._M_len = 5;
    bVar7 = Lexer::takeSExprStart(this,expected_01);
    if (bVar7) {
      Lexer::takeID((optional<wasm::Name> *)local_c0,this);
      p_Var1 = (__index_type *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
      tabletype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Type> *)p_Var1,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)p_Var1);
      if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x01') {
        type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._16_8_,
                   _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._16_8_);
        plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                         0x10);
        *(long **)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
        if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
            &local_48) {
          *plVar2 = local_48;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_40
          ;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
          *(long *)((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               local_48;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = uStack_50;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
LAB_00bc6ecb:
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      if (name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\0') {
        name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
             (size_t)(char *)0x0;
        local_c0 = (undefined1  [8])0x0;
      }
      type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
      type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
      local_48 = 0;
      NVar12.super_IString.str._M_str =
           (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                   _M_len;
      NVar12.super_IString.str._M_len = (size_t)local_c0;
      ParseModuleTypesCtx::addTable
                ((Result<wasm::Ok> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,ctx,NVar12,
                 (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                 ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                 (ImportNames *)
                 &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,
                 (Type)_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_,pos)
      ;
      if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ != 0) {
        operator_delete((void *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                _32_8_,
                        local_48 -
                        type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_);
      }
      if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage
          ._M_storage[0x18] == '\x01') {
        type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._16_8_,
                   _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                   name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Name>._16_8_);
        plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                                 super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                         0x10);
        *(long **)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
        if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
            &local_48) {
          *plVar2 = local_48;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_40
          ;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
          *(long *)((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               local_48;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        goto LAB_00bc6ecb;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
    }
    else {
      expected_02._M_str = "memory";
      expected_02._M_len = 6;
      bVar7 = Lexer::takeSExprStart(this,expected_02);
      if (bVar7) {
        Lexer::takeID((optional<wasm::Name> *)local_c0,this);
        p_Var1 = (__index_type *)
                 ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
        memtype<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)p_Var1,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,
                   (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)p_Var1);
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,
                     _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_);
          plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                           0x10);
          *(long **)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
          if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
              &local_48) {
            *plVar2 = local_48;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_40;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
            *(long *)((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_48;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = uStack_50;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged);
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
          return __return_storage_ptr__;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] = '\0';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20));
      }
      else {
        expected_03._M_str = "global";
        expected_03._M_len = 6;
        bVar7 = Lexer::takeSExprStart(this,expected_03);
        if (!bVar7) {
          expected_04._M_str = "tag";
          expected_04._M_len = 3;
          bVar7 = Lexer::takeSExprStart(this,expected_04);
          if (!bVar7) {
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"expected import description","");
            Lexer::err((Err *)((long)&_val.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20),this,&local_148);
            puVar3 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
            if ((undefined1 *)
                _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
                (undefined1 *)
                ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8U)) {
              *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 _M_u._9_7_,
                                 type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                 _M_u._M_first._M_storage._M_storage[8]);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(type.val.
                                     super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                     ._M_u._9_7_,
                                     type.val.
                                     super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                     ._M_u._M_first._M_storage._M_storage[8]);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                 type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_188.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
            _Var11._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p == &local_148.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_00bc678a;
          }
          Lexer::takeID((optional<wasm::Name> *)local_c0,this);
          p_Var1 = (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
          typeuse<wasm::WATParser::ParseModuleTypesCtx>
                    ((Result<wasm::WATParser::TypeUse> *)p_Var1,ctx,true);
          std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                          &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged,
                          (_Copy_ctor_base<false,_wasm::WATParser::TypeUse,_wasm::Err> *)p_Var1);
          if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
              _M_storage._M_storage[0x18] != '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeUse,_wasm::Err> *)
                              &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
            local_31 = name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
            local_c8 = (char *)local_c0;
            type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_index = '\0';
            type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._33_7_ = 0;
            local_48 = 0;
            local_1c8.type.id =
                 _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
            pRVar10 = (Result<wasm::WATParser::TypeUse> *)&DAT_00000008;
            if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] == '\0') {
              pRVar10 = &type;
            }
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                      (&local_1c8.names,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)pRVar10);
            pcVar9 = local_c8;
            if (local_31 == '\0') {
              pcVar9 = (char *)0x0;
              name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
                   = (size_t)(char *)0x0;
            }
            NVar13.super_IString.str._M_str =
                 (char *)name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                         str._M_len;
            NVar13.super_IString.str._M_len = (size_t)pcVar9;
            ParseModuleTypesCtx::addTag
                      ((Result<wasm::Ok> *)
                       &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,ctx,NVar13,
                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       (ImportNames *)
                       &nm.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,&local_1c8,pos);
            if (local_1c8.names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c8.names.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1c8.names.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1c8.names.
                                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ != 0) {
              operator_delete((void *)type.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>
                                      ._32_8_,
                              local_48 -
                              type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              _32_8_);
            }
            if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                _M_storage._M_storage[0x18] != '\x01') goto LAB_00bc6a8e;
            type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                       name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._16_8_,
                       _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_
                       + name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._16_8_);
            goto LAB_00bc69a5;
          }
          type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,
                     _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_);
          goto LAB_00bc6598;
        }
        Lexer::takeID((optional<wasm::Name> *)local_c0,this);
        this_00 = (_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                  ((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20);
        globaltype<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::WATParser::GlobalType> *)this_00,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_engaged,
                        (_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)this_00);
        if (_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\x01') {
          type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ = &local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_,
                     _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ +
                     name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._16_8_);
          plVar2 = (long *)((long)&(__return_storage_ptr__->val).
                                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                           0x10);
          *(long **)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = plVar2;
          if ((long *)type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
              &local_48) {
            *plVar2 = local_48;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_40;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                 super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
            *(long *)((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_48;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = uStack_50;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                              &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
          std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                              ((long)&_val.val.
                                      super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> +
                              0x20));
          return __return_storage_ptr__;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                          &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::Name>._M_engaged);
        p_Var8 = (_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)0x0;
        if (type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
            _M_storage._M_storage[0x18] == '\0') {
          p_Var8 = this_00;
        }
        uVar5 = *(undefined8 *)((long)&p_Var8->_M_u + 8);
        _Var6._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (ctx->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[ctx->index]._M_t.
             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
        *(bool *)((long)_Var6._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) =
             _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_4_ != 0;
        *(undefined8 *)
         ((long)_Var6._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = uVar5;
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
        _M_storage[0x18] = '\0';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &name.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
        ~_Variant_storage(this_00);
      }
    }
  }
  bVar7 = Lexer::takeRParen(this);
  if (bVar7) {
    bVar7 = Lexer::takeRParen(this);
    if (bVar7) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"expected end of import","");
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               this,&local_108);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
        (undefined1 *)
        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8U)) {
      *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _9_7_,type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               _M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_188.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
    _Var11._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"expected end of import description","");
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 0x20),
               this,&local_128);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ ==
        (undefined1 *)
        ((long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8U)) {
      *puVar3 = CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u.
                         _9_7_,type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                               _M_u._M_first._M_storage._M_storage[8]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first.
                    _M_storage._M_storage[8]);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_188.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
    _Var11._M_p = local_128._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p == &local_128.field_2) {
      return __return_storage_ptr__;
    }
  }
LAB_00bc678a:
  _val.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._32_8_ =
       (long)&type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err> + 8;
  type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._M_first._M_storage.
  _M_storage[8] = '\0';
  type.val.super__Variant_base<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::TypeUse,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::TypeUse,_wasm::Err>._M_u._0_8_ = 0;
  operator_delete(_Var11._M_p,local_188.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> import_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("import"sv)) {
    return {};
  }

  auto mod = ctx.in.takeName();
  if (!mod) {
    return ctx.in.err("expected import module name");
  }

  auto nm = ctx.in.takeName();
  if (!nm) {
    return ctx.in.err("expected import name");
  }
  ImportNames names{*mod, *nm};

  if (ctx.in.takeSExprStart("func"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    // TODO: function import annotations
    CHECK_ERR(ctx.addFunc(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, {}, pos));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto name = ctx.in.takeID();
    auto type = tabletype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTable(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto name = ctx.in.takeID();
    auto type = memtype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addMemory(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto name = ctx.in.takeID();
    auto type = globaltype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addGlobal(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, pos));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTag(name ? *name : Name{}, {}, &names, *type, pos));
  } else {
    return ctx.in.err("expected import description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import");
  }

  return Ok{};
}